

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *a_lhs,
               Matrix<double,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  XprTypeNested pMVar1;
  long rows;
  long cols;
  long depth;
  BlockingType blocking;
  undefined1 local_60 [24];
  XprTypeNested local_48;
  variable_if_dynamic<long,__1> local_40;
  
  rows = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((rows == (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows) &&
     (cols = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols,
     cols == (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols)) {
    if (((cols != 0) && (rows != 0)) &&
       (depth = (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols, depth != 0)) {
      if (cols == 1) {
        Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&blocking,dst,0);
        Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_60,
                   a_rhs,0);
        generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
        ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&blocking,a_lhs,
                   (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_60,
                   alpha);
      }
      else if (rows == 1) {
        Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&blocking,dst,0)
        ;
        Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_60,
                   a_lhs,0);
        generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
        ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&blocking,
                   (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_60,
                   a_rhs,alpha);
      }
      else {
        pMVar1 = (XprTypeNested)*alpha;
        gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
                  (&blocking,rows,cols,depth,1,true);
        local_60._0_8_ = a_lhs;
        local_60._8_8_ = a_rhs;
        local_60._16_8_ = dst;
        local_48 = pMVar1;
        local_40.m_value = (long)&blocking;
        parallelize_gemm<true,Eigen::internal::gemm_functor<double,long,Eigen::internal::general_matrix_matrix_product<long,double,0,false,double,0,false,0,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::gemm_blocking_space<0,double,double,_1,_1,_1,1,false>>,long>
                  ((gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
                    *)local_60,
                   (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,
                   (a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,false);
        gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::~gemm_blocking_space
                  (&blocking);
      }
    }
    return;
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1d6,
                "static void Eigen::internal::generic_product_impl<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, Eigen::DenseShape, Eigen::DenseShape, 8>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    if (dst.cols() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::ColXpr dst_vec(dst.col(0));
      return internal::generic_product_impl<Lhs,typename Rhs::ConstColXpr,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs, a_rhs.col(0), alpha);
    }
    else if (dst.rows() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::RowXpr dst_vec(dst.row(0));
      return internal::generic_product_impl<typename Lhs::ConstRowXpr,Rhs,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs.row(0), a_rhs, alpha);
    }

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = combine_scalar_factors(alpha, a_lhs, a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,
        Dest::InnerStrideAtCompileTime>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }